

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O1

void __thiscall
QCborContainerPrivate::appendByteData
          (QCborContainerPrivate *this,char *data,qsizetype len,Type type,ValueFlags extraFlags)

{
  long in_FS_OFFSET;
  anon_union_8_2_4ee71171_for_Element_0 local_38;
  Type local_30;
  uint local_2c;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.value = addByteDataImpl(&this->data,&this->usedData,data,len);
  local_2c = (uint)extraFlags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
                   super_QFlagsStorage<QtCbor::Element::ValueFlag>.i | 2;
  local_30 = type;
  QtPrivate::QPodArrayOps<QtCbor::Element>::emplace<QtCbor::Element>
            ((QPodArrayOps<QtCbor::Element> *)&this->elements,(this->elements).d.size,
             (Element *)&local_38);
  QList<QtCbor::Element>::end(&this->elements);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendByteData(const char *data, qsizetype len, QCborValue::Type type,
                        QtCbor::Element::ValueFlags extraFlags = {})
    {
        elements.append(QtCbor::Element(addByteData(data, len), type,
                                        QtCbor::Element::HasByteData | extraFlags));
    }